

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

btVector3 operator-(btVector3 *v)

{
  btScalar *in_RDI;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c [3];
  btVector3 local_10;
  
  local_1c[0] = -*in_RDI;
  local_20 = -in_RDI[1];
  local_24 = -in_RDI[2];
  btVector3::btVector3(&local_10,local_1c,&local_20,&local_24);
  return (btVector3)local_10.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE))
	__m128 r = _mm_xor_ps(v.mVec128, btvMzeroMask);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	return btVector3((btSimdFloat4)veorq_s32((int32x4_t)v.mVec128, (int32x4_t)btvMzeroMask));
#else
	return btVector3(-v.m_floats[0], -v.m_floats[1], -v.m_floats[2]);
#endif
}